

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack8to1_int8.h
# Opt level: O0

void ncnn::convolution_pack8to1_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  ulong *puVar8;
  char *pcVar9;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int s4 [4];
  __m128i _s4;
  __m128i _s1;
  __m128i _s0;
  __m128i _sh;
  __m128i _sl;
  __m128i _w;
  __m128i _val;
  int k;
  char *sptr;
  Mat m;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  allocator_type *__a;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  Mat *this;
  undefined1 local_3a8 [16];
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  int local_334;
  Mat local_328;
  int local_2dc;
  Mat local_2d8;
  ulong *local_290;
  int local_284;
  int local_280;
  int local_27c;
  Mat local_278;
  int *local_230;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  reference local_210;
  allocator_type local_1f1;
  vector<int,_std::allocator<int>_> local_1f0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 *local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  ulong local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ulong uStack_120;
  ulong local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ulong uStack_100;
  undefined1 local_f8 [16];
  ulong local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  ulong local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined8 uStack_30;
  ulong *local_20;
  ulong local_18;
  undefined8 uStack_10;
  ulong *local_8;
  
  local_1c0 = *(int *)(in_RDI + 0x2c);
  local_1c4 = *(int *)(in_RDI + 0x38);
  local_1c8 = *(int *)(in_RSI + 0x2c);
  local_1cc = *(int *)(in_RSI + 0x30);
  local_1d0 = *(int *)(in_RSI + 0x38);
  local_1d4 = in_ECX * in_R8D;
  __a = &local_1f1;
  local_1bc = in_R9D;
  local_1b8 = in_R8D;
  local_1b4 = in_ECX;
  std::allocator<int>::allocator((allocator<int> *)0x2a8384);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),__a);
  std::allocator<int>::~allocator((allocator<int> *)0x2a83aa);
  local_210 = std::vector<int,_std::allocator<int>_>::operator[](&local_1f0,0);
  local_214 = 0;
  local_218 = 0;
  local_21c = local_1c0 * in_stack_00000008 - local_1b4 * local_1bc;
  for (local_220 = 0; local_220 < local_1b8; local_220 = local_220 + 1) {
    for (local_224 = 0; local_224 < local_1b4; local_224 = local_224 + 1) {
      local_210[local_214] = local_218;
      local_214 = local_214 + 1;
      local_218 = local_1bc + local_218;
    }
    local_218 = local_21c + local_218;
  }
  for (local_228 = 0; local_228 < local_1d0; local_228 = local_228 + 1) {
    Mat::channel(this,in_stack_fffffffffffffc54);
    piVar7 = Mat::operator_cast_to_int_(&local_278);
    Mat::~Mat((Mat *)0x2a853a);
    local_230 = piVar7;
    for (local_27c = 0; local_27c < local_1cc; local_27c = local_27c + 1) {
      for (local_280 = 0; local_280 < local_1c8; local_280 = local_280 + 1) {
        local_284 = 0;
        Mat::channel(this,in_stack_fffffffffffffc54);
        puVar8 = (ulong *)Mat::operator_cast_to_signed_char_(&local_2d8);
        Mat::~Mat((Mat *)0x2a85cc);
        local_290 = puVar8;
        for (local_2dc = 0; local_2dc < local_1c4; local_2dc = local_2dc + 1) {
          Mat::channel(this,in_stack_fffffffffffffc54);
          pcVar9 = Mat::row<signed_char_const>(&local_328,local_27c * in_stack_00000018);
          for (local_334 = 0; local_334 < local_1d4; local_334 = local_334 + 1) {
            local_8 = (ulong *)(pcVar9 + (long)(local_210[local_334] << 3) +
                                         (long)(local_280 * in_stack_00000010 * 8));
            local_118 = *local_8;
            uStack_10 = 0;
            local_158 = ZEXT816(0) << 0x20;
            local_148._8_8_ = SUB168(ZEXT816(0),4);
            local_108 = 0;
            uStack_100 = local_148._8_8_;
            uStack_110 = 0;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_148._8_8_;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_118;
            local_d8 = vpcmpgtb_avx(auVar5 << 0x40,auVar2);
            uStack_c0 = 0;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_118;
            auVar2 = vpunpcklbw_avx(auVar4,local_d8);
            local_20 = local_290;
            local_138 = *local_290;
            uStack_30 = 0;
            local_128 = 0;
            uStack_120 = local_148._8_8_;
            uStack_130 = 0;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_148._8_8_;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_138;
            local_f8 = vpcmpgtb_avx(auVar6 << 0x40,auVar1);
            uStack_e0 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_138;
            auVar3 = vpunpcklbw_avx(auVar3,local_f8);
            local_348 = auVar2._0_8_;
            uStack_340 = auVar2._8_8_;
            local_358 = auVar3._0_8_;
            uStack_350 = auVar3._8_8_;
            local_a8 = local_348;
            uStack_a0 = uStack_340;
            local_b8 = local_358;
            uStack_b0 = uStack_350;
            auVar1 = vpmullw_avx(auVar2,auVar3);
            local_88 = local_348;
            uStack_80 = uStack_340;
            local_98 = local_358;
            uStack_90 = uStack_350;
            auVar2 = vpmulhw_avx(auVar2,auVar3);
            local_368 = auVar1._0_8_;
            uStack_360 = auVar1._8_8_;
            local_378 = auVar2._0_8_;
            uStack_370 = auVar2._8_8_;
            local_68 = local_368;
            uStack_60 = uStack_360;
            local_78 = local_378;
            uStack_70 = uStack_370;
            auVar3 = vpunpcklwd_avx(auVar1,auVar2);
            local_48 = local_368;
            uStack_40 = uStack_360;
            local_58 = local_378;
            uStack_50 = uStack_370;
            auVar2 = vpunpckhwd_avx(auVar1,auVar2);
            local_388 = auVar3._0_8_;
            uStack_380 = auVar3._8_8_;
            local_398 = auVar2._0_8_;
            uStack_390 = auVar2._8_8_;
            local_188 = local_388;
            uStack_180 = uStack_380;
            local_198 = local_398;
            uStack_190 = uStack_390;
            local_3a8 = vpaddd_avx(auVar3,auVar2);
            local_160 = &stack0xfffffffffffffc48;
            uStack_170 = uStack_3a0;
            in_stack_fffffffffffffc54 = local_3a8._12_4_;
            local_284 = local_3a8._0_4_ + local_3a8._4_4_ + local_3a8._8_4_ +
                        in_stack_fffffffffffffc54 + local_284;
            local_290 = local_290 + 1;
            local_178 = this;
            local_148 = local_158;
            local_e8 = local_138;
            local_c8 = local_118;
            local_38 = local_138;
            local_18 = local_118;
          }
          Mat::~Mat((Mat *)0x2a89d2);
        }
        local_230[local_280] = local_284;
      }
      local_230 = local_230 + local_1c8;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  return;
}

Assistant:

static void convolution_pack8to1_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                    for (int k = 0; k < maxk; k++)
                    {
                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                        _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                        __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                        _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                        __m128i _sl = _mm_mullo_epi16(_val, _w);
                        __m128i _sh = _mm_mulhi_epi16(_val, _w);
                        __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                        __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                        __m128i _s4 = _mm_add_epi32(_s0, _s1);

                        // TODO use _mm_hadd_epi32 on ssse3
                        int s4[4];
                        _mm_storeu_si128((__m128i*)s4, _s4);
                        sum += s4[0] + s4[1] + s4[2] + s4[3]; // dot

                        kptr += 8;
                    }
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }
}